

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t inlen)

{
  int iVar1;
  int ret;
  size_t inlen_local;
  void *input_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0x127d,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  if (0xffffff < (tls->traffic_protection).enc.seq) {
    tls->field_0x160 = tls->field_0x160 & 0xf7 | 8;
  }
  if (((byte)tls->field_0x160 >> 3 & 1) != 0) {
    iVar1 = update_send_key(tls,sendbuf,(uint)((byte)tls->field_0x160 >> 4 & 1));
    if (iVar1 != 0) {
      return iVar1;
    }
    tls->field_0x160 = tls->field_0x160 & 0xf7;
    tls->field_0x160 = tls->field_0x160 & 0xef;
  }
  iVar1 = buffer_push_encrypted_records
                    (sendbuf,'\x17',(uint8_t *)input,inlen,&(tls->traffic_protection).enc);
  return iVar1;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t inlen)
{
    assert(tls->traffic_protection.enc.aead != NULL);

    /* "For AES-GCM, up to 2^24.5 full-size records (about 24 million) may be encrypted on a given connection while keeping a
     * safety margin of approximately 2^-57 for Authenticated Encryption (AE) security." (RFC 8446 section 5.5)
     */
    if (tls->traffic_protection.enc.seq >= 16777216)
        tls->needs_key_update = 1;

    if (tls->needs_key_update) {
        int ret;
        if ((ret = update_send_key(tls, sendbuf, tls->key_update_send_request)) != 0)
            return ret;
        tls->needs_key_update = 0;
        tls->key_update_send_request = 0;
    }

    return buffer_push_encrypted_records(sendbuf, PTLS_CONTENT_TYPE_APPDATA, input, inlen, &tls->traffic_protection.enc);
}